

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputOpenStuff(Node *this,ostream *os,Node *Channel)

{
  ostream *poVar1;
  undefined1 local_830 [32];
  undefined1 local_810 [32];
  undefined1 local_7f0 [32];
  undefined1 local_7d0 [32];
  undefined1 local_7b0 [32];
  undefined1 local_790 [32];
  undefined1 local_770 [32];
  undefined1 local_750 [32];
  undefined1 local_730 [32];
  undefined1 local_710 [32];
  undefined1 local_6f0 [32];
  undefined1 local_6d0 [32];
  undefined1 local_6b0 [32];
  undefined1 local_690 [32];
  undefined1 local_670 [32];
  undefined1 local_650 [32];
  undefined1 local_630 [32];
  undefined1 local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  undefined1 local_570 [32];
  undefined1 local_550 [32];
  undefined1 local_530 [32];
  undefined1 local_510 [32];
  undefined1 local_4f0 [32];
  undefined1 local_4d0 [32];
  undefined1 local_4b0 [32];
  undefined1 local_490 [32];
  undefined1 local_470 [32];
  undefined1 local_450 [32];
  undefined1 local_430 [32];
  undefined1 local_410 [32];
  undefined1 local_3f0 [32];
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [32];
  undefined1 local_390 [32];
  undefined1 local_370 [32];
  undefined1 local_350 [32];
  undefined1 local_330 [32];
  undefined1 local_310 [32];
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  undefined1 local_270 [32];
  undefined1 local_250 [32];
  undefined1 local_230 [32];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [48];
  undefined1 local_40 [40];
  Node *Channel_local;
  ostream *os_local;
  Node *this_local;
  
  local_40._32_8_ = Channel;
  Channel_local = (Node *)os;
  os_local = (ostream *)this;
  switch(this->Type) {
  case 0x102:
    Indent_abi_cxx11_((Node *)local_650);
    poVar1 = std::operator<<(os,(string *)local_650);
    GetIPChannel_abi_cxx11_((Node *)local_670,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_670);
    poVar1 = std::operator<<(poVar1,".SetAccess(");
    poVar1 = std::operator<<(poVar1,(string *)&this->Tree[0]->TextValue);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_670);
    std::__cxx11::string::~string((string *)local_650);
    break;
  default:
    Indent_abi_cxx11_((Node *)local_7f0);
    poVar1 = std::operator<<(os,(string *)local_7f0);
    GetIPChannel_abi_cxx11_((Node *)local_810,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_810);
    poVar1 = std::operator<<(poVar1,".GoofyOpenStuff(");
    Expression_abi_cxx11_((Node *)local_830);
    poVar1 = std::operator<<(poVar1,(string *)local_830);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_830);
    std::__cxx11::string::~string((string *)local_810);
    std::__cxx11::string::~string((string *)local_7f0);
    break;
  case 0x104:
    Indent_abi_cxx11_((Node *)local_690);
    poVar1 = std::operator<<(os,(string *)local_690);
    GetIPChannel_abi_cxx11_((Node *)local_6b0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_6b0);
    poVar1 = std::operator<<(poVar1,".SetAllow(");
    poVar1 = std::operator<<(poVar1,(string *)&this->Tree[0]->TextValue);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_6b0);
    std::__cxx11::string::~string((string *)local_690);
    break;
  case 0x105:
    Indent_abi_cxx11_((Node *)local_470);
    poVar1 = std::operator<<(os,(string *)local_470);
    GetIPChannel_abi_cxx11_((Node *)local_490,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_490);
    poVar1 = std::operator<<(poVar1,".SetKey(");
    Expression_abi_cxx11_((Node *)local_4b0);
    poVar1 = std::operator<<(poVar1,(string *)local_4b0);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_490);
    std::__cxx11::string::~string((string *)local_470);
    break;
  case 0x10c:
    Indent_abi_cxx11_((Node *)local_230);
    poVar1 = std::operator<<(os,(string *)local_230);
    GetIPChannel_abi_cxx11_((Node *)local_250,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_250);
    poVar1 = std::operator<<(poVar1,".SetBlockSize(");
    Expression_abi_cxx11_((Node *)local_270);
    poVar1 = std::operator<<(poVar1,(string *)local_270);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)local_230);
    break;
  case 0x10d:
    Indent_abi_cxx11_((Node *)local_290);
    poVar1 = std::operator<<(os,(string *)local_290);
    GetIPChannel_abi_cxx11_((Node *)local_2b0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_2b0);
    poVar1 = std::operator<<(poVar1,".SetBucketSize(");
    Expression_abi_cxx11_((Node *)local_2d0);
    poVar1 = std::operator<<(poVar1,(string *)local_2d0);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)local_290);
    break;
  case 0x10e:
    Indent_abi_cxx11_((Node *)local_350);
    poVar1 = std::operator<<(os,(string *)local_350);
    GetIPChannel_abi_cxx11_((Node *)local_370,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_370);
    poVar1 = std::operator<<(poVar1,".SetBuffer(");
    Expression_abi_cxx11_((Node *)local_390);
    poVar1 = std::operator<<(poVar1,(string *)local_390);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string((string *)local_350);
    break;
  case 0x11a:
    Indent_abi_cxx11_((Node *)local_b0);
    poVar1 = std::operator<<(os,(string *)local_b0);
    GetIPChannel_abi_cxx11_((Node *)local_d0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_d0);
    poVar1 = std::operator<<(poVar1,".SetClusterSize(");
    Expression_abi_cxx11_((Node *)local_f0);
    poVar1 = std::operator<<(poVar1,(string *)local_f0);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_b0);
    break;
  case 0x11e:
    Indent_abi_cxx11_((Node *)local_510);
    poVar1 = std::operator<<(os,(string *)local_510);
    GetIPChannel_abi_cxx11_((Node *)local_530,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_530);
    poVar1 = std::operator<<(poVar1,".SetContiguous(True);");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_530);
    std::__cxx11::string::~string((string *)local_510);
    break;
  case 0x120:
    Indent_abi_cxx11_((Node *)local_6d0);
    poVar1 = std::operator<<(os,(string *)local_6d0);
    GetIPChannel_abi_cxx11_((Node *)local_6f0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_6f0);
    poVar1 = std::operator<<(poVar1,".SetConnect(BasicChannel[");
    Expression_abi_cxx11_((Node *)local_710);
    poVar1 = std::operator<<(poVar1,(string *)local_710);
    poVar1 = std::operator<<(poVar1,"]);");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_710);
    std::__cxx11::string::~string((string *)local_6f0);
    std::__cxx11::string::~string((string *)local_6d0);
    break;
  case 0x127:
    Indent_abi_cxx11_((Node *)local_3b0);
    poVar1 = std::operator<<(os,(string *)local_3b0);
    GetIPChannel_abi_cxx11_((Node *)local_3d0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_3d0);
    poVar1 = std::operator<<(poVar1,".SetDefaultName(");
    Expression_abi_cxx11_((Node *)local_3f0);
    poVar1 = std::operator<<(poVar1,(string *)local_3f0);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3d0);
    std::__cxx11::string::~string((string *)local_3b0);
    break;
  case 0x136:
    Indent_abi_cxx11_((Node *)local_170);
    poVar1 = std::operator<<(os,(string *)local_170);
    GetIPChannel_abi_cxx11_((Node *)local_190,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_190);
    poVar1 = std::operator<<(poVar1,".SetExtendSize(");
    Expression_abi_cxx11_((Node *)local_1b0);
    poVar1 = std::operator<<(poVar1,(string *)local_1b0);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_170);
    break;
  case 0x13a:
    Indent_abi_cxx11_((Node *)local_110);
    poVar1 = std::operator<<(os,(string *)local_110);
    GetIPChannel_abi_cxx11_((Node *)local_130,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_130);
    poVar1 = std::operator<<(poVar1,".SetFileSize(");
    Expression_abi_cxx11_((Node *)local_150);
    poVar1 = std::operator<<(poVar1,(string *)local_150);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)local_110);
    break;
  case 0x161:
    Indent_abi_cxx11_((Node *)local_730);
    poVar1 = std::operator<<(os,(string *)local_730);
    GetIPChannel_abi_cxx11_((Node *)local_750,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_750);
    poVar1 = std::operator<<(poVar1,".SetMap(");
    Expression_abi_cxx11_((Node *)local_770);
    poVar1 = std::operator<<(poVar1,(string *)local_770);
    poVar1 = std::operator<<(poVar1,", sizeof(");
    Expression_abi_cxx11_((Node *)local_790);
    poVar1 = std::operator<<(poVar1,(string *)local_790);
    poVar1 = std::operator<<(poVar1,"));");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_790);
    std::__cxx11::string::~string((string *)local_770);
    std::__cxx11::string::~string((string *)local_750);
    std::__cxx11::string::~string((string *)local_730);
    break;
  case 0x166:
    Indent_abi_cxx11_((Node *)local_2f0);
    poVar1 = std::operator<<(os,(string *)local_2f0);
    GetIPChannel_abi_cxx11_((Node *)local_310,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_310);
    poVar1 = std::operator<<(poVar1,".SetMode(");
    Expression_abi_cxx11_((Node *)local_330);
    poVar1 = std::operator<<(poVar1,(string *)local_330);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_330);
    std::__cxx11::string::~string((string *)local_310);
    std::__cxx11::string::~string((string *)local_2f0);
    break;
  case 0x170:
    Indent_abi_cxx11_((Node *)local_550);
    poVar1 = std::operator<<(os,(string *)local_550);
    GetIPChannel_abi_cxx11_((Node *)local_570,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_570);
    poVar1 = std::operator<<(poVar1,".SetRewind(False);");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_570);
    std::__cxx11::string::~string((string *)local_550);
    break;
  case 0x171:
    Indent_abi_cxx11_((Node *)local_590);
    poVar1 = std::operator<<(os,(string *)local_590);
    GetIPChannel_abi_cxx11_((Node *)local_5b0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_5b0);
    poVar1 = std::operator<<(poVar1,".SetSpan(False);");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_5b0);
    std::__cxx11::string::~string((string *)local_590);
    break;
  case 0x175:
    Indent_abi_cxx11_((Node *)local_610);
    poVar1 = std::operator<<(os,(string *)local_610);
    GetIPChannel_abi_cxx11_((Node *)local_630,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_630);
    poVar1 = std::operator<<(poVar1,".SetOrginization(");
    std::operator<<(poVar1,(string *)&this->Tree[0]->TextValue);
    std::__cxx11::string::~string((string *)local_630);
    std::__cxx11::string::~string((string *)local_610);
    if (this->Tree[0]->Tree[0] != (Node *)0x0) {
      poVar1 = std::operator<<((ostream *)Channel_local,", ");
      std::operator<<(poVar1,(string *)&this->Tree[0]->Tree[0]->TextValue);
    }
    poVar1 = std::operator<<((ostream *)Channel_local,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 0x179:
    Indent_abi_cxx11_((Node *)local_410);
    poVar1 = std::operator<<(os,(string *)local_410);
    GetIPChannel_abi_cxx11_((Node *)local_430,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_430);
    poVar1 = std::operator<<(poVar1,".SetKey(");
    Expression_abi_cxx11_((Node *)local_450);
    poVar1 = std::operator<<(poVar1,(string *)local_450);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_450);
    std::__cxx11::string::~string((string *)local_430);
    std::__cxx11::string::~string((string *)local_410);
    break;
  case 0x184:
    Indent_abi_cxx11_((Node *)local_7b0);
    poVar1 = std::operator<<(os,(string *)local_7b0);
    GetIPChannel_abi_cxx11_((Node *)local_7d0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_7d0);
    poVar1 = std::operator<<(poVar1,".SetRecordType(");
    poVar1 = std::operator<<(poVar1,(string *)&this->Tree[0]->TextValue);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_7d0);
    std::__cxx11::string::~string((string *)local_7b0);
    break;
  case 0x185:
    Indent_abi_cxx11_((Node *)local_40);
    poVar1 = std::operator<<(os,(string *)local_40);
    GetIPChannel_abi_cxx11_((Node *)local_70,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_70);
    poVar1 = std::operator<<(poVar1,".SetRecordSize(");
    Expression_abi_cxx11_((Node *)local_90);
    poVar1 = std::operator<<(poVar1,(string *)local_90);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_40);
    break;
  case 0x19c:
    Indent_abi_cxx11_((Node *)local_5d0);
    poVar1 = std::operator<<(os,(string *)local_5d0);
    GetIPChannel_abi_cxx11_((Node *)local_5f0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_5f0);
    poVar1 = std::operator<<(poVar1,".SetSpan(True);");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_5f0);
    std::__cxx11::string::~string((string *)local_5d0);
    break;
  case 0x1a5:
    Indent_abi_cxx11_((Node *)local_4d0);
    poVar1 = std::operator<<(os,(string *)local_4d0);
    GetIPChannel_abi_cxx11_((Node *)local_4f0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_4f0);
    poVar1 = std::operator<<(poVar1,".SetTemporary(True);");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_4f0);
    std::__cxx11::string::~string((string *)local_4d0);
    break;
  case 0x1b5:
    break;
  case 0x1b9:
    Indent_abi_cxx11_((Node *)local_1d0);
    poVar1 = std::operator<<(os,(string *)local_1d0);
    GetIPChannel_abi_cxx11_((Node *)local_1f0,(int)local_40._32_8_);
    poVar1 = std::operator<<(poVar1,(string *)local_1f0);
    poVar1 = std::operator<<(poVar1,".SetWindowSize(");
    Expression_abi_cxx11_((Node *)local_210);
    poVar1 = std::operator<<(poVar1,(string *)local_210);
    poVar1 = std::operator<<(poVar1,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  if (this->Block[0] != (Node *)0x0) {
    OutputOpenStuff(this->Block[0],(ostream *)Channel_local,(Node *)local_40._32_8_);
  }
  return;
}

Assistant:

void Node::OutputOpenStuff(
	std::ostream& os,	/**< iosream to write C++ code to */
	Node* Channel		/**< Basic IO channel */
)
{
	switch(Type)
	{
	case BAS_S_RECORDSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecordSize(" << Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_CLUSTERSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetClusterSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_FILESIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetFileSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_EXTENDSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetExtendSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_WINDOWSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetWindowSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BLOCKSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBlockSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BUCKETSIZE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBucketSize(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_MODE:

		os << Indent() <<
			GetIPChannel(Channel, 0)<<
			".SetMode(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_BUFFER:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetBuffer(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_DEFAULTNAME:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetDefaultName(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_PRIMARY:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_ALTERNATE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;

	case BAS_S_TEMPORARY:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetTemporary(True);" << std::endl;
		break;

	case BAS_S_CONTIGUOUS:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetContiguous(True);" << std::endl;
		break;

	case BAS_S_NOREWIND:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRewind(False);" << std::endl;
		break;

	case BAS_S_NOSPAN:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetSpan(False);" << std::endl;
		break;

	case BAS_S_SPAN:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetSpan(True);" << std::endl;
		break;

	case BAS_S_ORGANIZATION:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetOrginization(" << Tree[0]->TextValue;
		if (Tree[0]->Tree[0] != 0)
		{
			os << ", " << Tree[0]->Tree[0]->TextValue;
		}
		os << ");" << std::endl;
		break;

	case BAS_S_ACCESS:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetAccess(" << Tree[0]->TextValue << ");" <<
			std::endl;
		break;

	case BAS_S_ALLOW:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetAllow(" << Tree[0]->TextValue << ");" <<
			std::endl;
		break;

	case BAS_S_CONNECT:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetConnect(BasicChannel[" << Tree[0]->Expression() << "]);" <<
			std::endl;
		break;

	case BAS_S_MAP:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetMap(" << Tree[0]->Expression() << ", sizeof(" <<
			Tree[0]->Expression() <<
			"));" << std::endl;
		break;

	case BAS_S_RECORDTYPE:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecordType(" << Tree[0]->TextValue <<
			");" << std::endl;
		break;

	case BAS_S_VIRTUAL:
		break;

	default:

		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".GoofyOpenStuff(" << Expression() << ");" <<
			std::endl;
		break;

	}

	//
	// Handle downlink
	//
	if (Block[0] != 0)
	{
		Block[0]->OutputOpenStuff(os, Channel);
	}
}